

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O2

void xray_re::xr_file_system::split_path(char *path,string *folder,string *name,string *extension)

{
  CPath p;
  path local_90;
  string local_68 [32];
  path local_48;
  
  CPath::CPath((CPath *)&local_48,path);
  if (folder != (string *)0x0) {
    std::filesystem::__cxx11::path::parent_path();
    std::__cxx11::string::string(local_68,(string *)&local_90);
    std::__cxx11::string::operator=((string *)folder,local_68);
    std::__cxx11::string::~string(local_68);
    std::filesystem::__cxx11::path::~path(&local_90);
  }
  if (name != (string *)0x0) {
    std::filesystem::__cxx11::path::stem(&local_90,&local_48);
    std::__cxx11::string::string(local_68,(string *)&local_90);
    std::__cxx11::string::operator=((string *)name,local_68);
    std::__cxx11::string::~string(local_68);
    std::filesystem::__cxx11::path::~path(&local_90);
  }
  if (extension != (string *)0x0) {
    std::filesystem::__cxx11::path::extension(&local_90,&local_48);
    std::__cxx11::string::string(local_68,(string *)&local_90);
    std::__cxx11::string::operator=((string *)extension,local_68);
    std::__cxx11::string::~string(local_68);
    std::filesystem::__cxx11::path::~path(&local_90);
  }
  std::filesystem::__cxx11::path::~path(&local_48);
  return;
}

Assistant:

void xr_file_system::split_path(const char* path, std::string* folder, std::string* name, std::string* extension)
{
CPath p(path);

	if(folder != nullptr)
		folder->assign(p.parent_path());

	if(name != nullptr)
		name->assign(p.stem());

	if(extension != nullptr)
		extension->assign(p.extension());
}